

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

bool __thiscall
cmOrderDirectoriesConstraintSOName::FindConflict
          (cmOrderDirectoriesConstraintSOName *this,string *dir)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  string base;
  
  if ((this->SOName)._M_string_length == 0) {
    this_00 = &cmGlobalGenerator::GetDirectoryContent
                         ((this->super_cmOrderDirectoriesConstraint).GlobalGenerator,dir,true)->_M_t
    ;
    std::__cxx11::string::string
              ((string *)&base,(string *)&(this->super_cmOrderDirectoriesConstraint).FileName);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::lower_bound(this_00,&base);
    base._M_dataplus._M_p[base._M_string_length - 1] =
         base._M_dataplus._M_p[base._M_string_length - 1] + '\x01';
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::upper_bound(this_00,&base);
    std::__cxx11::string::~string((string *)&base);
    if (cVar2._M_node != cVar3._M_node) {
      return true;
    }
  }
  else {
    bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                      (&this->super_cmOrderDirectoriesConstraint,dir,&this->SOName);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmOrderDirectoriesConstraintSOName::FindConflict(std::string const& dir)
{
  // Determine which type of check to do.
  if (!this->SOName.empty()) {
    // We have the library soname.  Check if it will be found.
    if (this->FileMayConflict(dir, this->SOName)) {
      return true;
    }
  } else {
    // We do not have the soname.  Look for files in the directory
    // that may conflict.
    std::set<std::string> const& files =
      (this->GlobalGenerator->GetDirectoryContent(dir, true));

    // Get the set of files that might conflict.  Since we do not
    // know the soname just look at all files that start with the
    // file name.  Usually the soname starts with the library name.
    std::string base = this->FileName;
    auto first = files.lower_bound(base);
    ++base.back();
    auto last = files.upper_bound(base);
    if (first != last) {
      return true;
    }
  }
  return false;
}